

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

void yang_free_ext_data(yang_ext_substmt *substmt)

{
  char *__ptr;
  char **__ptr_00;
  long lVar1;
  
  if (substmt != (yang_ext_substmt *)0x0) {
    free(substmt->ext_substmt);
    __ptr_00 = substmt->ext_modules;
    if (__ptr_00 != (char **)0x0) {
      __ptr = *__ptr_00;
      if (__ptr != (char *)0x0) {
        lVar1 = 8;
        do {
          free(__ptr);
          __ptr_00 = substmt->ext_modules;
          __ptr = *(char **)((long)__ptr_00 + lVar1);
          lVar1 = lVar1 + 8;
        } while (__ptr != (char *)0x0);
      }
      free(__ptr_00);
    }
    free(substmt);
    return;
  }
  return;
}

Assistant:

void
yang_free_ext_data(struct yang_ext_substmt *substmt)
{
    int i;

    if (!substmt) {
        return;
    }

    free(substmt->ext_substmt);
    if (substmt->ext_modules) {
        for (i = 0; substmt->ext_modules[i]; ++i) {
            free(substmt->ext_modules[i]);
        }
        free(substmt->ext_modules);
    }
    free(substmt);
}